

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O3

FTexture * PatchTexture_TryCreate(FileReader *file,int lumpnum)

{
  short sVar1;
  long lVar2;
  short *psVar3;
  ulong uVar4;
  FPatchTexture *this;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  patch_t header;
  patch_t pStack_28;
  
  if (0xc < file->Length) {
    psVar3 = (short *)operator_new__(file->Length);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
    (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,psVar3,file->Length);
    sVar1 = *psVar3;
    if ((ushort)(sVar1 - 1U) < 0x800 && (ushort)(psVar3[1] - 1U) < 0x800) {
      uVar4 = (ulong)(uint)(int)sVar1;
      lVar2 = file->Length;
      lVar6 = lVar2 + 3;
      if (-1 < lVar2) {
        lVar6 = lVar2;
      }
      if ((long)uVar4 < lVar6 >> 2) {
        bVar5 = true;
        uVar7 = 0;
        do {
          while( true ) {
            uVar7 = uVar7 + 1;
            if (*(uint *)(psVar3 + uVar7 * 2 + 2) != sVar1 * 4 + 8U) break;
            bVar5 = false;
            if (uVar7 == uVar4) {
              operator_delete__(psVar3);
              goto LAB_004fc7d1;
            }
          }
          if ((uint)lVar2 <= *(uint *)(psVar3 + uVar7 * 2 + 2)) goto LAB_004fc7aa;
        } while (uVar7 != uVar4);
        operator_delete__(psVar3);
        if (bVar5) {
          return (FTexture *)0x0;
        }
LAB_004fc7d1:
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&pStack_28,2);
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&pStack_28.height,2);
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&pStack_28.leftoffset,2);
        (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,&pStack_28.topoffset,2);
        this = (FPatchTexture *)operator_new(0x70);
        FPatchTexture::FPatchTexture(this,lumpnum,&pStack_28);
        return &this->super_FTexture;
      }
    }
LAB_004fc7aa:
    operator_delete__(psVar3);
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *PatchTexture_TryCreate(FileReader & file, int lumpnum)
{
	patch_t header;

	if (!CheckIfPatch(file)) return NULL;
	file.Seek(0, SEEK_SET);
	file >> header.width >> header.height >> header.leftoffset >> header.topoffset;
	return new FPatchTexture(lumpnum, &header);
}